

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::AutoReg::AutoReg
          (AutoReg *this,ITestInvoker *invoker,SourceLineInfo *lineInfo,StringRef *classOrMethod,
          NameAndTags *nameAndTags)

{
  IMutableRegistryHub *pIVar1;
  NonCopyable *in_RDI;
  NameAndTags *in_stack_00000138;
  string *in_stack_00000140;
  ITestInvoker *in_stack_00000148;
  TestCase *in_stack_fffffffffffffed0;
  string local_110 [32];
  undefined1 local_f0 [24];
  StringRef *in_stack_ffffffffffffff28;
  
  NonCopyable::NonCopyable(in_RDI);
  in_RDI->_vptr_NonCopyable = (_func_int **)&PTR__AutoReg_00a1c1c8;
  pIVar1 = getMutableRegistryHub();
  extractClassName_abi_cxx11_(in_stack_ffffffffffffff28);
  makeTestCase(in_stack_00000148,in_stack_00000140,in_stack_00000138,(SourceLineInfo *)this);
  (*pIVar1->_vptr_IMutableRegistryHub[4])(pIVar1,local_f0);
  TestCase::~TestCase(in_stack_fffffffffffffed0);
  std::__cxx11::string::~string(local_110);
  return;
}

Assistant:

AutoReg::AutoReg( ITestInvoker* invoker, SourceLineInfo const& lineInfo, StringRef const& classOrMethod, NameAndTags const& nameAndTags ) noexcept {
        CATCH_TRY {
            getMutableRegistryHub()
                    .registerTest(
                        makeTestCase(
                            invoker,
                            extractClassName( classOrMethod ),
                            nameAndTags,
                            lineInfo));
        }